

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O2

void __thiscall helics::zeromq::ZmqComms::closeReceiver(ZmqComms *this)

{
  string *__lhs;
  bool bVar1;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int __fd;
  ActionMessage *this_00;
  int in_R8D;
  allocator<char> local_109;
  socket_t pushSocket;
  undefined1 local_f8 [32];
  shared_ptr<ZmqContextManager> ctx;
  ActionMessage cmd;
  
  if ((uint)((this->super_NetworkCommsInterface).super_CommsInterface.txStatus._M_i + RECONNECTING)
      < 2) {
    ActionMessage::ActionMessage(&cmd,cmd_protocol);
    cmd.messageID = 0x16570bf;
    CommsInterface::transmit((CommsInterface *)this,(route_id)0xffffffff,&cmd);
    ActionMessage::~ActionMessage(&cmd);
  }
  else if (((this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i & 1U
           ) == 0) {
    cmd._0_8_ = &cmd.dest_id;
    cmd.source_id.gid = 0;
    cmd.source_handle.hid = 0;
    cmd.dest_id.gid._0_1_ = 0;
    ZmqContextManager::getContextPointer((ZmqContextManager *)&ctx,(string *)&cmd);
    std::__cxx11::string::~string((string *)&cmd);
    zmq::socket_t::socket_t
              (&pushSocket,
               ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               zcontext)._M_t.
               super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
               super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
               super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,8);
    cmd.messageAction = 200;
    zmq::detail::socket_base::setsockopt<int>(&pushSocket.super_socket_base,0x11,&cmd.messageAction)
    ;
    __lhs = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    bVar1 = std::operator==(__lhs,"tcp://*");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f8,"tcp://127.0.0.1",&local_109);
      gmlc::networking::makePortAddress
                ((string *)&cmd,(string *)local_f8,
                 (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
      zmq::detail::socket_base::connect
                (&pushSocket.super_socket_base,cmd.messageAction,__addr,in_ECX);
      std::__cxx11::string::~string((string *)&cmd);
      this_00 = (ActionMessage *)local_f8;
    }
    else {
      gmlc::networking::makePortAddress
                ((string *)&cmd,__lhs,
                 (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
      zmq::detail::socket_base::connect
                (&pushSocket.super_socket_base,cmd.messageAction,__addr_00,in_ECX);
      this_00 = &cmd;
    }
    std::__cxx11::string::~string((string *)this_00);
    ActionMessage::ActionMessage(&cmd,cmd_protocol);
    cmd.messageID = 0x16570bf;
    ActionMessage::to_string_abi_cxx11_((string *)local_f8,&cmd);
    __fd = (int)local_f8;
    zmq::detail::socket_base::send
              (&pushSocket.super_socket_base,__fd,(void *)0x0,CONCAT44(in_register_0000000c,in_ECX),
               in_R8D);
    std::__cxx11::string::~string((string *)local_f8);
    ActionMessage::~ActionMessage(&cmd);
    zmq::socket_t::close(&pushSocket,__fd);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void ZmqComms::closeReceiver()
{
    switch (getTxStatus()) {
        case ConnectionStatus::STARTUP:
        case ConnectionStatus::CONNECTED: {
            ActionMessage cmd(CMD_PROTOCOL);
            cmd.messageID = CLOSE_RECEIVER;
            transmit(control_route, cmd);
        }

        break;
        default:
            if (!disconnecting) {
                // try connecting with the receivers push socket
                auto ctx = ZmqContextManager::getContextPointer();
                zmq::socket_t pushSocket(ctx->getBaseContext(), ZMQ_PUSH);
                pushSocket.setsockopt(ZMQ_LINGER, 200);
                if (localTargetAddress == "tcp://*") {
                    pushSocket.connect(makePortAddress("tcp://127.0.0.1", PortNumber));
                } else {
                    pushSocket.connect(makePortAddress(localTargetAddress, PortNumber));
                }

                ActionMessage cmd(CMD_PROTOCOL);
                cmd.messageID = CLOSE_RECEIVER;
                pushSocket.send(cmd.to_string());
            }
            break;
    }
}